

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O0

Vec3<float> * __thiscall Imath_3_2::Vec3<float>::normalize(Vec3<float> *this)

{
  Vec3<float> *in_RDI;
  float fVar1;
  float l;
  
  fVar1 = length(in_RDI);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    in_RDI->x = in_RDI->x / fVar1;
    in_RDI->y = in_RDI->y / fVar1;
    in_RDI->z = in_RDI->z / fVar1;
  }
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE inline const Vec3<T>&
Vec3<T>::normalize () IMATH_NOEXCEPT
{
    T l = length ();

    if (IMATH_LIKELY (l != T (0)))
    {
        //
        // Do not replace the divisions by l with multiplications by 1/l.
        // Computing 1/l can overflow but the divisions below will always
        // produce results less than or equal to 1.
        //

        x /= l;
        y /= l;
        z /= l;
    }

    return *this;
}